

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O1

void __thiscall Js::EquivalentTypeSet::SortAndRemoveDuplicates(EquivalentTypeSet *this)

{
  char *pcVar1;
  JITTypeHolderBase<Memory::Recycler> *pJVar2;
  JITTypeHolderBase<Memory::Recycler> *pJVar3;
  JITType *pJVar4;
  JITTypeHolderBase<void> JVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  short sVar9;
  ulong uVar10;
  long lVar11;
  ushort uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  JITTypeHolderBase<void> local_70;
  JITType *local_68;
  JITType *local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  EquivalentTypeSet *local_38;
  
  local_40 = (ulong)this->count;
  local_38 = this;
  if (1 < local_40) {
    lVar11 = 8;
    uVar10 = 0;
    uVar15 = 1;
    lVar6 = lVar11;
    uVar7 = uVar10;
LAB_00413199:
    do {
      local_48 = uVar7;
      local_50 = lVar6;
      local_58 = uVar15;
      pJVar2 = (this->types).ptr;
      uVar15 = uVar10 & 0xffffffff;
      bVar8 = JITTypeHolderBase<Memory::Recycler>::operator>
                        (pJVar2 + uVar15,
                         (JITTypeHolderBase<Memory::Recycler> *)((long)&(pJVar2->t).ptr + lVar11));
      if (bVar8) {
        pJVar2 = (local_38->types).ptr;
        pcVar1 = (char *)((long)&(pJVar2->t).ptr + lVar11);
        local_68 = *(JITType **)((long)&(pJVar2->t).ptr + lVar11);
        local_60 = pJVar2[uVar15].t.ptr;
        Memory::Recycler::WBSetBit(pcVar1);
        this = local_38;
        *(JITType **)((long)&(pJVar2->t).ptr + lVar11) = local_60;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar1);
        pJVar2 = (this->types).ptr + uVar15;
        Memory::Recycler::WBSetBit((char *)pJVar2);
        (pJVar2->t).ptr = local_68;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pJVar2);
        lVar11 = lVar11 + -8;
        sVar9 = (short)uVar10;
        uVar10 = uVar10 - 1;
        uVar15 = local_58;
        lVar6 = local_50;
        uVar7 = local_48;
        if (sVar9 != 0) goto LAB_00413199;
      }
      uVar10 = local_48 + 1;
      lVar11 = local_50 + 8;
      uVar15 = local_58 + 1;
      lVar6 = lVar11;
      uVar7 = uVar10;
    } while (local_58 + 1 != local_40);
  }
  iVar13 = (int)local_40;
  uVar14 = 1;
  if (1 < (ushort)local_40) {
    uVar10 = 8;
    uVar15 = 0;
    do {
      pJVar2 = (this->types).ptr;
      bVar8 = JITTypeHolderBase<Memory::Recycler>::operator!=
                        (pJVar2 + (uVar15 & 0xffff),
                         (JITTypeHolderBase<Memory::Recycler> *)((long)&(pJVar2->t).ptr + uVar10));
      if (bVar8) {
        pJVar3 = (this->types).ptr;
        uVar15 = (ulong)((int)uVar15 + 1);
        pJVar2 = pJVar3 + (uVar15 & 0xffff);
        pJVar4 = *(JITType **)((long)&(pJVar3->t).ptr + uVar10);
        Memory::Recycler::WBSetBit((char *)pJVar2);
        this = local_38;
        (pJVar2->t).ptr = pJVar4;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pJVar2);
      }
      uVar10 = uVar10 + 8;
    } while ((uint)(iVar13 * 8) != uVar10);
    uVar14 = (int)uVar15 + 1;
    iVar13 = (int)local_40;
  }
  this->count = (ushort)uVar14;
  if ((ushort)uVar14 < (ushort)iVar13) {
    uVar10 = (ulong)((uVar14 & 0xffff) << 3);
    uVar14 = iVar13 - uVar14;
    do {
      JITTypeHolderBase<void>::JITTypeHolderBase(&local_70,(JITType *)0x0);
      JVar5.t = local_70.t;
      pJVar2 = (local_38->types).ptr;
      pcVar1 = (char *)((long)&(pJVar2->t).ptr + uVar10);
      Memory::Recycler::WBSetBit(pcVar1);
      this = local_38;
      *(Type *)((long)&(pJVar2->t).ptr + uVar10) = JVar5.t;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar1);
      uVar10 = uVar10 + 8;
      uVar12 = (short)uVar14 - 1;
      uVar14 = (uint)uVar12;
    } while (uVar12 != 0);
  }
  this->sortedAndDuplicatesRemoved = true;
  return;
}

Assistant:

void EquivalentTypeSet::SortAndRemoveDuplicates()
{
    uint16 oldCount = this->count;
    uint16 i;

    // sorting
    for (i = 1; i < oldCount; i++)
    {
        uint16 j = i;
        while (j > 0 && (this->types[j - 1] > this->types[j]))
        {
            JITTypeHolder tmp = this->types[j];
            this->types[j] = this->types[j - 1];
            this->types[j - 1] = tmp;
            j--;
        }
    }

    // removing duplicate types from the sorted set
    i = 0;
    for (uint16 j = 1; j < oldCount; j++)
    {
        if (this->types[i] != this->types[j])
        {
            this->types[++i] = this->types[j];
        }
    }
    this->count = ++i;
    for (i; i < oldCount; i++)
    {
        this->types[i] = JITTypeHolder(nullptr);
    }

    this->sortedAndDuplicatesRemoved = true;
}